

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializerTest.cpp
# Opt level: O0

SAX2XMLReader * getParser(XMLGrammarPool *theGramPool,bool setHandler)

{
  MemoryManager *pMVar1;
  SAX2XMLReader *pSVar2;
  ErrorHandler *local_40;
  ContentHandler *local_28;
  SAX2XMLReader *parser;
  bool setHandler_local;
  XMLGrammarPool *theGramPool_local;
  
  pMVar1 = xercesc_4_0::XMLGrammarPool::getMemoryManager(theGramPool);
  pSVar2 = (SAX2XMLReader *)xercesc_4_0::XMLReaderFactory::createXMLReader(pMVar1,theGramPool);
  (*pSVar2->_vptr_SAX2XMLReader[0xc])
            (pSVar2,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,(ulong)doNamespaces & 1);
  (*pSVar2->_vptr_SAX2XMLReader[0xc])
            (pSVar2,&xercesc_4_0::XMLUni::fgXercesSchema,(ulong)doSchema & 1);
  (*pSVar2->_vptr_SAX2XMLReader[0xc])(pSVar2,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
  (*pSVar2->_vptr_SAX2XMLReader[0xc])
            (pSVar2,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,(ulong)schemaFullChecking & 1);
  (*pSVar2->_vptr_SAX2XMLReader[0xc])
            (pSVar2,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,(ulong)namespacePrefixes & 1);
  if (valScheme == Val_Auto) {
    (*pSVar2->_vptr_SAX2XMLReader[0xc])(pSVar2,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
    (*pSVar2->_vptr_SAX2XMLReader[0xc])(pSVar2,&xercesc_4_0::XMLUni::fgXercesDynamic,1);
  }
  if (valScheme == Val_Never) {
    (*pSVar2->_vptr_SAX2XMLReader[0xc])(pSVar2,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,0);
  }
  if (valScheme == Val_Always) {
    (*pSVar2->_vptr_SAX2XMLReader[0xc])(pSVar2,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
    (*pSVar2->_vptr_SAX2XMLReader[0xc])(pSVar2,&xercesc_4_0::XMLUni::fgXercesDynamic,0);
  }
  if (setHandler) {
    local_28 = (ContentHandler *)0x0;
    if (handler != (XSerializerHandlers *)0x0) {
      local_28 = &(handler->super_DefaultHandler).super_ContentHandler;
    }
    (*pSVar2->_vptr_SAX2XMLReader[8])(pSVar2,local_28);
    local_40 = (ErrorHandler *)0x0;
    if (handler != (XSerializerHandlers *)0x0) {
      local_40 = &(handler->super_DefaultHandler).super_ErrorHandler;
    }
    (*pSVar2->_vptr_SAX2XMLReader[0xb])(pSVar2,local_40);
  }
  else {
    (*pSVar2->_vptr_SAX2XMLReader[8])(pSVar2,0);
    (*pSVar2->_vptr_SAX2XMLReader[0xb])(pSVar2,0);
  }
  return pSVar2;
}

Assistant:

static SAX2XMLReader* getParser(XMLGrammarPool* const theGramPool
                              , bool                  setHandler)
{
    SAX2XMLReader* parser = XMLReaderFactory::createXMLReader(theGramPool->getMemoryManager(), theGramPool);

    parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, doNamespaces);
    parser->setFeature(XMLUni::fgXercesSchema, doSchema);
    parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
    parser->setFeature(XMLUni::fgXercesSchemaFullChecking, schemaFullChecking);
    parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes, namespacePrefixes);

    if (valScheme == SAX2XMLReader::Val_Auto)
    {
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, true);
    }
    if (valScheme == SAX2XMLReader::Val_Never)
    {
        parser->setFeature(XMLUni::fgSAX2CoreValidation, false);
    }
    if (valScheme == SAX2XMLReader::Val_Always)
    {
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, false);
    }

    if (setHandler)
    {
        parser->setContentHandler(handler);
        parser->setErrorHandler(handler);
    }
    else
    {
        parser->setContentHandler(0);
        parser->setErrorHandler(0);
    }

    return parser;
}